

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void zeroPage(MemPage *pPage,int flags)

{
  byte bVar1;
  long lVar2;
  ushort uVar3;
  short sVar4;
  byte in_SIL;
  undefined1 *in_RDI;
  u16 first;
  u8 hdr;
  BtShared *pBt;
  uchar *data;
  MemPage *pPage_00;
  
  pPage_00 = *(MemPage **)(in_RDI + 0x50);
  lVar2 = *(long *)(in_RDI + 0x48);
  bVar1 = in_RDI[9];
  if ((*(ushort *)(lVar2 + 0x28) & 0xc) != 0) {
    memset((void *)((long)pPage_00->aiOvfl + ((ulong)bVar1 - 0x1c)),0,
           (ulong)(*(int *)(lVar2 + 0x38) - (uint)bVar1));
  }
  *(byte *)((long)pPage_00->aiOvfl + ((ulong)bVar1 - 0x1c)) = in_SIL;
  sVar4 = 8;
  if ((in_SIL & 8) == 0) {
    sVar4 = 0xc;
  }
  uVar3 = (ushort)bVar1 + sVar4;
  memset((void *)((long)pPage_00->aiOvfl + (long)(int)(bVar1 + 1) + -0x1c),0,4);
  *(undefined1 *)((long)pPage_00->aiOvfl + (long)(int)(bVar1 + 7) + -0x1c) = 0;
  *(char *)((long)pPage_00->aiOvfl + (long)(int)(bVar1 + 5) + -0x1c) =
       (char)((uint)*(undefined4 *)(lVar2 + 0x38) >> 8);
  *(char *)((long)pPage_00->aiOvfl + (long)(int)(bVar1 + 5) + -0x1b) =
       (char)*(undefined4 *)(lVar2 + 0x38);
  *(uint *)(in_RDI + 0x14) = *(int *)(lVar2 + 0x38) - (uint)uVar3 & 0xffff;
  decodeFlags(pPage_00,(int)((ulong)lVar2 >> 0x20));
  *(ushort *)(in_RDI + 0x12) = uVar3;
  *(ulong *)(in_RDI + 0x58) = (long)pPage_00->aiOvfl + ((ulong)*(uint *)(lVar2 + 0x34) - 0x1c);
  *(ulong *)(in_RDI + 0x60) = (long)pPage_00->aiOvfl + ((ulong)uVar3 - 0x1c);
  *(ulong *)(in_RDI + 0x68) = (long)pPage_00->aiOvfl + ((ulong)(byte)in_RDI[10] - 0x1c);
  in_RDI[0xc] = 0;
  *(short *)(in_RDI + 0x1a) = (short)*(undefined4 *)(lVar2 + 0x34) + -1;
  *(undefined2 *)(in_RDI + 0x18) = 0;
  *in_RDI = 1;
  return;
}

Assistant:

static void zeroPage(MemPage *pPage, int flags){
  unsigned char *data = pPage->aData;
  BtShared *pBt = pPage->pBt;
  u8 hdr = pPage->hdrOffset;
  u16 first;

  assert( sqlite3PagerPagenumber(pPage->pDbPage)==pPage->pgno || CORRUPT_DB );
  assert( sqlite3PagerGetExtra(pPage->pDbPage) == (void*)pPage );
  assert( sqlite3PagerGetData(pPage->pDbPage) == data );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pBt->btsFlags & BTS_FAST_SECURE ){
    memset(&data[hdr], 0, pBt->usableSize - hdr);
  }
  data[hdr] = (char)flags;
  first = hdr + ((flags&PTF_LEAF)==0 ? 12 : 8);
  memset(&data[hdr+1], 0, 4);
  data[hdr+7] = 0;
  put2byte(&data[hdr+5], pBt->usableSize);
  pPage->nFree = (u16)(pBt->usableSize - first);
  decodeFlags(pPage, flags);
  pPage->cellOffset = first;
  pPage->aDataEnd = &data[pBt->pageSize];
  pPage->aCellIdx = &data[first];
  pPage->aDataOfst = &data[pPage->childPtrSize];
  pPage->nOverflow = 0;
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nCell = 0;
  pPage->isInit = 1;
}